

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elimination_ordering.cpp
# Opt level: O2

void indigox::algorithm::RandomOrder(PermutableGraph_p *G,ElimOrder *order)

{
  pointer ppvVar1;
  uint uVar2;
  StoredVertexList *pSVar3;
  StoredVertexList *pSVar4;
  random_device rd;
  mt19937 ran;
  random_device rStack_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  ppvVar1 = (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish != ppvVar1) {
    (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
    _M_finish = ppvVar1;
  }
  pSVar3 = (StoredVertexList *)
           ((long)&((((G->super___shared_ptr<indigox::PermutableGraph,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->super__PermGraph).graph_.
                    super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_type + 0x18);
  pSVar4 = pSVar3;
  while (pSVar4 = *(StoredVertexList **)&pSVar4->super__List_base<void_*,_std::allocator<void_*>_>,
        pSVar4 != pSVar3) {
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (order,(value_type *)
                     ((long)&pSVar4->super__List_base<void_*,_std::allocator<void_*>_> + 0x10));
  }
  std::random_device::random_device(&rStack_2728);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,(ulong)uVar2);
  std::
  shuffle<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             (order->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
             super__Vector_impl_data._M_finish,&local_13a0);
  std::random_device::~random_device(&rStack_2728);
  return;
}

Assistant:

void RandomOrder(PermutableGraph_p G, ElimOrder& order) {
      order.clear();
      
      for (PermVertIterPair vs = G->GetVertices(); vs.first != vs.second; ++vs.first) {
        order.push_back(*vs.first);
      }
      
      std::random_device rd;
      std::mt19937 ran(rd());
      
      std::shuffle(order.begin(), order.end(), ran);
      
    }